

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void __thiscall
density::lifo_array<density_tests::TestObject<8UL,_2UL>_>::default_construct
          (lifo_array<density_tests::TestObject<8UL,_2UL>_> *this)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = -8;
  for (uVar2 = 0;
      uVar2 < (this->super_LifoArrayImpl<density_tests::TestObject<8UL,_2UL>,_false>).m_size;
      uVar2 = uVar2 + 1) {
    density_tests::TestObject<8UL,_2UL>::TestObject
              ((TestObject<8UL,_2UL> *)
               ((long)&(this->super_LifoArrayImpl<density_tests::TestObject<8UL,_2UL>,_false>).
                       m_elements[1].m_storage + lVar1));
    lVar1 = lVar1 + 8;
  }
  return;
}

Assistant:

void default_construct(std::false_type)
        {
            size_t element_index = 0;
            try
            {
                for (; element_index < m_size; element_index++)
                {
                    auto const dest = m_elements + element_index;
                    DENSITY_ASSUME(dest != nullptr);
                    new (dest) TYPE();
                }
            }
            catch (...)
            {
                // destroy all the elements constructed until now. The destructor of the base class will deallocate the block
                auto count_to_destroy = element_index;
                while (count_to_destroy > 0)
                {
                    --count_to_destroy;
                    m_elements[count_to_destroy].TYPE::~TYPE();
                }
                throw;
            }
        }